

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<PropertyDef>::emplace<PropertyDef_const&>
          (QMovableArrayOps<PropertyDef> *this,qsizetype i,PropertyDef *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  PropertyDef *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  PropertyDef tmp;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5e;
  byte bVar6;
  PropertyDef *this_00;
  Inserter local_188;
  undefined1 local_160 [344];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<PropertyDef>::needsDetach((QArrayDataPointer<PropertyDef> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->name).d.size) &&
       (qVar3 = QArrayDataPointer<PropertyDef>::freeSpaceAtEnd
                          ((QArrayDataPointer<PropertyDef> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe5e,
                                                   CONCAT24(in_stack_fffffffffffffe5c,
                                                            in_stack_fffffffffffffe58)))),
       qVar3 != 0)) {
      QArrayDataPointer<PropertyDef>::end((QArrayDataPointer<PropertyDef> *)in_RDI);
      PropertyDef::PropertyDef
                (in_RDI,(PropertyDef *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
                );
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
      goto LAB_00170d54;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<PropertyDef>::freeSpaceAtBegin
                          ((QArrayDataPointer<PropertyDef> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe5e,
                                                   CONCAT24(in_stack_fffffffffffffe5c,
                                                            in_stack_fffffffffffffe58)))),
       qVar3 != 0)) {
      QArrayDataPointer<PropertyDef>::begin((QArrayDataPointer<PropertyDef> *)0x170c1a);
      PropertyDef::PropertyDef
                (in_RDI,(PropertyDef *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
                );
      (in_RDI->name).d.ptr = (in_RDI->name).d.ptr + -0x158;
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
      goto LAB_00170d54;
    }
  }
  memset(local_160,0xaa,0x158);
  PropertyDef::PropertyDef
            (in_RDI,(PropertyDef *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  bVar4 = (in_RDI->name).d.size != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<PropertyDef>::detachAndGrow
            ((QArrayDataPointer<PropertyDef> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (PropertyDef **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffe5c,uVar2))),
             (QArrayDataPointer<PropertyDef> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<PropertyDef> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffe5c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_fffffffffffffe48));
    Inserter::insertOne((Inserter *)in_RDI,(PropertyDef *)CONCAT17(uVar5,in_stack_fffffffffffffe48))
    ;
    Inserter::~Inserter(&local_188);
  }
  else {
    QArrayDataPointer<PropertyDef>::begin((QArrayDataPointer<PropertyDef> *)0x170ce2);
    PropertyDef::PropertyDef(in_RDI,(PropertyDef *)CONCAT17(uVar5,in_stack_fffffffffffffe48));
    (in_RDI->name).d.ptr = (in_RDI->name).d.ptr + -0x158;
    (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
  }
  PropertyDef::~PropertyDef(in_RDI);
LAB_00170d54:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }